

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testNumberOfNeighborsWithInvalidRange(void)

{
  bool bVar1;
  Int64Range *pIVar2;
  ostream *poVar3;
  undefined1 local_140 [80];
  undefined1 local_f0 [84];
  undefined4 local_9c;
  Result local_98;
  SingleKdTreeIndex *kdTree;
  NearestNeighborsIndex *nnIndex;
  Int64Parameter *numberOfNeighbors;
  KNearestNeighborsClassifier *knnClassifier;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  numberOfNeighbors =
       (Int64Parameter *)
       CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  nnIndex = (NearestNeighborsIndex *)
            CoreML::Specification::KNearestNeighborsClassifier::mutable_numberofneighbors
                      ((KNearestNeighborsClassifier *)numberOfNeighbors);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
  CoreML::Specification::Int64Range::set_minvalue(pIVar2,-1);
  pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
  CoreML::Specification::Int64Range::set_maxvalue(pIVar2,10);
  CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,5);
  CoreML::Specification::KNearestNeighborsClassifier::mutable_uniformweighting
            ((KNearestNeighborsClassifier *)numberOfNeighbors);
  kdTree = (SingleKdTreeIndex *)
           CoreML::Specification::KNearestNeighborsClassifier::mutable_nearestneighborsindex
                     ((KNearestNeighborsClassifier *)numberOfNeighbors);
  CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
            ((NearestNeighborsIndex *)kdTree);
  local_98.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NearestNeighborsIndex::mutable_singlekdtreeindex
                 ((NearestNeighborsIndex *)kdTree);
  CoreML::Specification::SingleKdTreeIndex::set_leafsize
            ((SingleKdTreeIndex *)local_98.m_message._M_storage._M_storage,0x1e);
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel
            ((KNearestNeighborsClassifier *)numberOfNeighbors,"Default");
  CoreML::validate<(MLModelType)404>(&local_98,(Model *)local_40);
  bVar1 = CoreML::Result::good(&local_98);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x238);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  else {
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
    CoreML::Specification::Int64Range::set_minvalue(pIVar2,0);
    pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
    CoreML::Specification::Int64Range::set_maxvalue(pIVar2,10);
    CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,5);
    CoreML::validate<(MLModelType)404>((Result *)(local_f0 + 0x28),(Model *)local_40);
    CoreML::Result::operator=(&local_98,(Result *)(local_f0 + 0x28));
    CoreML::Result::~Result((Result *)(local_f0 + 0x28));
    bVar1 = CoreML::Result::good(&local_98);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x240);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((res).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
    else {
      pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
      CoreML::Specification::Int64Range::set_minvalue(pIVar2,10);
      pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
      CoreML::Specification::Int64Range::set_maxvalue(pIVar2,1);
      CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,5);
      CoreML::validate<(MLModelType)404>((Result *)local_f0,(Model *)local_40);
      CoreML::Result::operator=(&local_98,(Result *)local_f0);
      CoreML::Result::~Result((Result *)local_f0);
      bVar1 = CoreML::Result::good(&local_98);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x248);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"!((res).good())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
      else {
        pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
        CoreML::Specification::Int64Range::set_minvalue(pIVar2,-10);
        pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
        CoreML::Specification::Int64Range::set_maxvalue(pIVar2,-5);
        CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,5);
        CoreML::validate<(MLModelType)404>((Result *)(local_140 + 0x28),(Model *)local_40);
        CoreML::Result::operator=(&local_98,(Result *)(local_140 + 0x28));
        CoreML::Result::~Result((Result *)(local_140 + 0x28));
        bVar1 = CoreML::Result::good(&local_98);
        if (bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x250);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"!((res).good())");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
        else {
          pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
          CoreML::Specification::Int64Range::set_minvalue(pIVar2,1);
          pIVar2 = CoreML::Specification::Int64Parameter::mutable_range((Int64Parameter *)nnIndex);
          CoreML::Specification::Int64Range::set_maxvalue(pIVar2,10);
          CoreML::Specification::Int64Parameter::set_defaultvalue((Int64Parameter *)nnIndex,5);
          CoreML::validate<(MLModelType)404>((Result *)local_140,(Model *)local_40);
          CoreML::Result::operator=(&local_98,(Result *)local_140);
          CoreML::Result::~Result((Result *)local_140);
          bVar1 = CoreML::Result::good(&local_98);
          if (bVar1) {
            m1._oneof_case_[0] = 0;
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                                    );
            poVar3 = std::operator<<(poVar3,":");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,600);
            poVar3 = std::operator<<(poVar3,": error: ");
            poVar3 = std::operator<<(poVar3,"(res).good()");
            poVar3 = std::operator<<(poVar3," was false, expected true.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
        }
      }
    }
  }
  local_9c = 1;
  CoreML::Result::~Result(&local_98);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testNumberOfNeighborsWithInvalidRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(-1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since range bounds should be > 0
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(0);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range bounds should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(10);
    numberOfNeighbors->mutable_range()->set_maxvalue(1);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since since range max should be > range min
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(-10);
    numberOfNeighbors->mutable_range()->set_maxvalue(-5);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range values must be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}